

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::AdapterPromiseNode<kj::AuthenticatedStream,kj::WaiterQueue<kj::AuthenticatedStream>::Node>::
AdapterPromiseNode<kj::List<kj::WaiterQueue<kj::AuthenticatedStream>::BaseNode,&kj::WaiterQueue<kj::AuthenticatedStream>::BaseNode::link>&>
          (AdapterPromiseNode<kj::AuthenticatedStream,kj::WaiterQueue<kj::AuthenticatedStream>::Node>
           *this,List<kj::WaiterQueue<kj::AuthenticatedStream>::BaseNode,_&kj::WaiterQueue<kj::AuthenticatedStream>::BaseNode::link>
                 *params)

{
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined ***)this = &PTR_destroy_0064d958;
  *(undefined ***)(this + 0x18) = &PTR_reject_0064d9a8;
  this[0x20] = (AdapterPromiseNode<kj::AuthenticatedStream,kj::WaiterQueue<kj::AuthenticatedStream>::Node>
                )0x0;
  this[0x1b8] = (AdapterPromiseNode<kj::AuthenticatedStream,kj::WaiterQueue<kj::AuthenticatedStream>::Node>
                 )0x0;
  this[0x1e0] = (AdapterPromiseNode<kj::AuthenticatedStream,kj::WaiterQueue<kj::AuthenticatedStream>::Node>
                 )0x1;
  WaiterQueue<kj::AuthenticatedStream>::Node::Node
            ((Node *)(this + 0x1e8),(PromiseFulfiller<kj::AuthenticatedStream> *)(this + 0x18),
             params);
  return;
}

Assistant:

AdapterPromiseNode(Params&&... params)
      : adapter(static_cast<PromiseFulfiller<UnfixVoid<T>>&>(*this), kj::fwd<Params>(params)...) {}